

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

void __thiscall APhyBullet::BulletWorld::BulletWorld(BulletWorld *this,btDynamicsWorld *handle)

{
  (this->super_world).super_base_interface._vptr_base_interface =
       (_func_int **)&PTR__BulletWorld_0021aa48;
  this->handle = handle;
  (this->collisionDispatcher).counter = (Counter *)0x0;
  (this->broadphase).counter = (Counter *)0x0;
  (this->constraintSolver).counter = (Counter *)0x0;
  (this->collisionConfiguration).counter = (Counter *)0x0;
  (this->collisionObjects)._M_h._M_buckets = &(this->collisionObjects)._M_h._M_single_bucket;
  (this->collisionObjects)._M_h._M_bucket_count = 1;
  (this->collisionObjects)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->collisionObjects)._M_h._M_element_count = 0;
  (this->collisionObjects)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->collisionObjects)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->collisionObjects)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->characterControllers)._M_h._M_buckets = &(this->characterControllers)._M_h._M_single_bucket
  ;
  (this->characterControllers)._M_h._M_bucket_count = 1;
  (this->characterControllers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->characterControllers)._M_h._M_element_count = 0;
  (this->characterControllers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->characterControllers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->characterControllers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->debugDrawer).
  super___shared_ptr<APhyBullet::BulletWorldDebugDrawer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->debugDrawer).
  super___shared_ptr<APhyBullet::BulletWorldDebugDrawer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

BulletWorld::BulletWorld(btDynamicsWorld *handle)
    : handle(handle)
{
}